

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall
BuildWithDepsLogTestDepsIgnoredInDryRun::Run(BuildWithDepsLogTestDepsIgnoredInDryRun *this)

{
  VirtualFileSystem *this_00;
  int *piVar1;
  int iVar2;
  CommandRunner *pCVar3;
  Test *pTVar4;
  unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_> uVar5;
  bool bVar6;
  Node *pNVar7;
  int iVar8;
  string err;
  Builder builder;
  State state;
  allocator<char> local_249;
  string local_248;
  string local_228;
  Builder local_208;
  State local_130;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"out",(allocator<char> *)&local_248);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"",(allocator<char> *)&local_228);
  this_00 = &(this->super_BuildWithDepsLogTest).super_BuildTest.fs_;
  VirtualFileSystem::Create(this_00,(string *)&local_130,(string *)&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_130);
  piVar1 = &(this->super_BuildWithDepsLogTest).super_BuildTest.fs_.now_;
  *piVar1 = *piVar1 + 1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"in1",(allocator<char> *)&local_248);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"",(allocator<char> *)&local_228);
  VirtualFileSystem::Create(this_00,(string *)&local_130,(string *)&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_130);
  State::State(&local_130);
  iVar2 = g_current_test->assertion_failures_;
  StateTestWithBuiltinRules::AddCatRule((StateTestWithBuiltinRules *)this,&local_130);
  iVar8 = g_current_test->assertion_failures_;
  if (iVar2 == iVar8) {
    AssertParse(&local_130,"build out: cat in1\n  deps = gcc\n  depfile = in1.d\n",
                (ManifestParserOptions)0x0);
    iVar8 = g_current_test->assertion_failures_;
    if (iVar2 == iVar8) {
      (this->super_BuildWithDepsLogTest).super_BuildTest.config_.dry_run = true;
      Builder::Builder(&local_208,&local_130,
                       &(this->super_BuildWithDepsLogTest).super_BuildTest.config_,(BuildLog *)0x0,
                       (DepsLog *)0x0,&this_00->super_DiskInterface);
      uVar5._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
      super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
      super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
           (__uniq_ptr_data<CommandRunner,_std::default_delete<CommandRunner>,_true,_true>)
           &(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_;
      if (local_208.command_runner_._M_t.
          super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
          super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
          super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)0x0) {
        pCVar3 = (CommandRunner *)
                 local_208.command_runner_._M_t.
                 super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                 super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                 super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
        local_208.command_runner_._M_t.
        super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
        super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
        super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
             uVar5._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>.
             _M_t.super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
             super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
        (*pCVar3->_vptr_CommandRunner[1])();
        uVar5._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
        super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
        super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
             local_208.command_runner_._M_t.
             super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
             super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
             super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
      }
      local_208.command_runner_._M_t.
      super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
      super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
      super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
           uVar5._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t
           .super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
           super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.commands_ran_);
      pTVar4 = g_current_test;
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      local_248._M_string_length = 0;
      local_248.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"out",&local_249);
      pNVar7 = Builder::AddTarget(&local_208,&local_228,&local_248);
      testing::Test::Check
                (pTVar4,pNVar7 != (Node *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0x8d9,"builder.AddTarget(\"out\", &err)");
      std::__cxx11::string::~string((string *)&local_228);
      pTVar4 = g_current_test;
      bVar6 = std::operator==("",&local_248);
      bVar6 = testing::Test::Check
                        (pTVar4,bVar6,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x8da,"\"\" == err");
      pTVar4 = g_current_test;
      if (bVar6) {
        bVar6 = Builder::Build(&local_208,&local_248);
        testing::Test::Check
                  (pTVar4,bVar6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                   ,0x8db,"builder.Build(&err)");
        bVar6 = testing::Test::Check
                          (g_current_test,
                           (long)(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                                 commands_ran_.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                                 commands_ran_.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start == 0x20,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                           ,0x8dc,"1u == command_runner_.commands_ran_.size()");
        if (bVar6) {
          local_208.command_runner_._M_t.
          super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
          super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
          super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
               (__uniq_ptr_data<CommandRunner,_std::default_delete<CommandRunner>,_true,_true>)
               (__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)0x0;
        }
        else {
          g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
        }
      }
      else {
        g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
      }
      std::__cxx11::string::~string((string *)&local_248);
      Builder::~Builder(&local_208);
      goto LAB_0012caea;
    }
  }
  g_current_test->assertion_failures_ = iVar8 + 1;
LAB_0012caea:
  State::~State(&local_130);
  return;
}

Assistant:

TEST_F(BuildWithDepsLogTest, DepsIgnoredInDryRun) {
  const char* manifest =
      "build out: cat in1\n"
      "  deps = gcc\n"
      "  depfile = in1.d\n";

  fs_.Create("out", "");
  fs_.Tick();
  fs_.Create("in1", "");

  State state;
  ASSERT_NO_FATAL_FAILURE(AddCatRule(&state));
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state, manifest));

  // The deps log is NULL in dry runs.
  config_.dry_run = true;
  Builder builder(&state, config_, NULL, NULL, &fs_);
  builder.command_runner_.reset(&command_runner_);
  command_runner_.commands_ran_.clear();

  string err;
  EXPECT_TRUE(builder.AddTarget("out", &err));
  ASSERT_EQ("", err);
  EXPECT_TRUE(builder.Build(&err));
  ASSERT_EQ(1u, command_runner_.commands_ran_.size());

  builder.command_runner_.release();
}